

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_get(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  fdb_kvs_id_t id;
  size_t __n;
  docio_handle *handle_00;
  filemgr *file;
  snap_handle *shandle;
  hbtrie *trie;
  btreeblk_handle *handle_01;
  size_t sVar2;
  fdb_status fVar3;
  hbtrie_result hVar4;
  int64_t iVar5;
  long lVar6;
  undefined1 *buf;
  fdb_doc *pfVar7;
  void *pvVar8;
  fdb_doc *pfVar9;
  fdb_txn *txn;
  fdb_doc *pfVar10;
  ulong chunksize;
  void *__dest;
  bool bVar11;
  bool body_alloc;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  fdb_doc doc_kv;
  _fdb_key_cmp_info cmp_info;
  undefined1 auStack_78 [8];
  docio_object _doc;
  uint64_t offset;
  
  buf = local_f8;
  auStack_78._0_2_ = 0;
  auStack_78._2_2_ = 0;
  auStack_78._4_4_ = 0;
  _doc.length.keylen = 0;
  _doc.length.metalen = 0;
  _doc.length.bodylen = 0;
  _doc.length.bodylen_ondisk = 0;
  _doc.timestamp = 0;
  _doc._20_4_ = 0;
  _doc.key = (void *)0x0;
  _doc.field_3.seqnum = 0;
  _doc.meta = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (doc == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc->key == (void *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (0xffffffffffff007f < doc->keylen - 0xff81) {
    if (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) &&
       ((ulong)((handle->config).blocksize - 0x100) < doc->keylen)) {
      return FDB_RESULT_INVALID_ARGS;
    }
    LOCK();
    bVar11 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar11) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (!bVar11) {
      return FDB_RESULT_HANDLE_BUSY;
    }
    pfVar10 = (fdb_doc *)local_f8;
    pfVar7 = doc;
    pfVar9 = pfVar10;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pfVar9->keylen = pfVar7->keylen;
      pfVar7 = (fdb_doc *)&pfVar7->metalen;
      pfVar9 = (fdb_doc *)&pfVar9->metalen;
    }
    if (handle->kvs != (kvs_info *)0x0) {
      chunksize = (ulong)(handle->config).chunksize;
      local_f8 = (undefined1  [8])(doc->keylen + chunksize);
      lVar6 = -(doc->keylen + chunksize + 0xf & 0xfffffffffffffff0);
      buf = local_f8 + lVar6;
      id = handle->kvs->id;
      doc_kv.size_ondisk = (size_t)buf;
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1353ff;
      kvid2buf(chunksize,id,buf);
      __dest = (void *)(chunksize + doc_kv.size_ondisk);
      __n = doc->keylen;
      pvVar8 = doc->key;
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x135415;
      memcpy(__dest,pvVar8,__n);
    }
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x135447;
      fdb_check_file_reopen(handle,(file_status_t *)0x0);
      txn = handle->fhandle->root->txn;
      if (txn == (fdb_txn *)0x0) {
        txn = &handle->file->global_txn;
      }
    }
    else {
      txn = handle->shandle->snap_txn;
    }
    doc_kv.deleted = (handle->kvs_config).create_if_missing;
    doc_kv._73_3_ = *(undefined3 *)&(handle->kvs_config).field_0x1;
    doc_kv.flags = *(uint32_t *)&(handle->kvs_config).field_0x4;
    handle_00 = handle->dhandle;
    fVar3 = FDB_RESULT_KEY_NOT_FOUND;
    if ((handle->config).do_not_search_wal == false) {
      file = handle->file;
      shandle = handle->shandle;
      pfVar7 = pfVar10;
      if (handle->kvs == (kvs_info *)0x0) {
        pfVar7 = doc;
      }
      *(undefined8 *)(buf + -8) = 0x1354bf;
      fVar3 = wal_find(txn,file,(_fdb_key_cmp_info *)&doc_kv.deleted,shandle,pfVar7,
                       (uint64_t *)&_doc.body);
    }
    if (handle->shandle == (snap_handle *)0x0) {
      *(undefined8 *)(buf + -8) = 0x1354d4;
      fdb_sync_db_header(handle);
    }
    LOCK();
    paVar1 = &handle->op_stats->num_gets;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      *(undefined8 *)(buf + -8) = 0x1354eb;
      _fdb_sync_dirty_root(handle);
      trie = handle->trie;
      pvVar8 = (void *)doc_kv.size_ondisk;
      if (handle->kvs == (kvs_info *)0x0) {
        pvVar8 = doc->key;
        pfVar10 = doc;
      }
      sVar2 = pfVar10->keylen;
      *(undefined8 *)(buf + -8) = 0x13551a;
      hVar4 = hbtrie_find(trie,pvVar8,(int)sVar2,&_doc.body);
      handle_01 = handle->bhandle;
      *(undefined8 *)(buf + -8) = 0x135526;
      btreeblk_end(handle_01);
      _doc.body = (void *)((ulong)_doc.body >> 0x38 | ((ulong)_doc.body & 0xff000000000000) >> 0x28
                           | ((ulong)_doc.body & 0xff0000000000) >> 0x18 |
                           ((ulong)_doc.body & 0xff00000000) >> 8 |
                           ((ulong)_doc.body & 0xff000000) << 8 |
                           ((ulong)_doc.body & 0xff0000) << 0x18 |
                           ((ulong)_doc.body & 0xff00) << 0x28 | (long)_doc.body << 0x38);
      *(undefined8 *)(buf + -8) = 0x135537;
      _fdb_release_dirty_root(handle);
      bVar11 = hVar4 == HBTRIE_RESULT_SUCCESS;
    }
    else {
      bVar11 = false;
    }
    pvVar8 = _doc.body;
    if ((fVar3 == FDB_RESULT_SUCCESS && _doc.body != (void *)0xffffffffffffffff) || (bVar11)) {
      _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
      _doc.meta = doc->body;
      bVar11 = (void *)_doc.field_3.seqnum == (void *)0x0;
      body_alloc = _doc.meta == (void *)0x0;
      if (handle->kvs == (kvs_info *)0x0) {
        _doc._16_8_ = doc->key;
        auStack_78._0_2_ = (undefined2)doc->keylen;
      }
      else {
        _doc._16_8_ = doc_kv.size_ondisk;
        doc->deleted = (bool)doc_kv.body._0_1_;
        auStack_78._0_2_ = local_f8._0_2_;
      }
      if ((fVar3 != FDB_RESULT_SUCCESS) || (doc->deleted != true)) {
        *(undefined8 *)(buf + -8) = 0x1355e9;
        iVar5 = docio_read_doc(handle_00,(uint64_t)pvVar8,(docio_object *)auStack_78,true);
        if (0 < iVar5) {
          if ((local_f8 == (undefined1  [8])((ulong)auStack_78 & 0xffff)) &&
             ((_doc.length._0_8_ & 0x400000000) == 0)) {
            doc->seqnum = (fdb_seqnum_t)_doc.key;
            doc->metalen = (ulong)auStack_78 >> 0x10 & 0xffff;
            doc->bodylen = (ulong)auStack_78 >> 0x20;
            doc->meta = (void *)_doc.field_3;
            doc->body = _doc.meta;
            doc->deleted = false;
            doc->size_ondisk =
                 (ulong)((auStack_78._0_4_ & 0xffff) + ((uint)auStack_78._0_4_ >> 0x10) +
                        _doc.length._0_4_) + 0x20;
            doc->offset = (uint64_t)_doc.body;
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            return FDB_RESULT_SUCCESS;
          }
          *(undefined8 *)(buf + -8) = 0x135675;
          free_docio_object((docio_object *)auStack_78,'\0',bVar11,body_alloc);
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          return FDB_RESULT_KEY_NOT_FOUND;
        }
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        if (iVar5 != 0) {
          return (fdb_status)iVar5;
        }
        return FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_KEY_NOT_FOUND;
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_get(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct filemgr *wal_file = NULL;
    struct docio_handle *dhandle;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || !doc->key || doc->keylen == 0 ||
        doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    doc_kv = *doc;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_kv.keylen = doc->keylen + size_chunk;
        doc_kv.key = alca(uint8_t, doc_kv.keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_kv.key);
        memcpy((uint8_t*)doc_kv.key + size_chunk, doc->key, doc->keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, &doc_kv,
                          &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc,
                          &offset);
        }
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        if (handle->kvs) {
            hr = hbtrie_find(handle->trie, doc_kv.key, doc_kv.keylen,
                             (void *)&offset);
        } else {
            hr = hbtrie_find(handle->trie, doc->key, doc->keylen,
                             (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         hr == HBTRIE_RESULT_SUCCESS) {
        bool alloced_meta = doc->meta ? false : true;
        bool alloced_body = doc->body ? false : true;
        if (handle->kvs) {
            _doc.key = doc_kv.key;
            _doc.length.keylen = doc_kv.keylen;
            doc->deleted = doc_kv.deleted; // update deleted field if wal_find
        } else {
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
        }
        _doc.meta = doc->meta;
        _doc.body = doc->body;

        if (wr == FDB_RESULT_SUCCESS && doc->deleted) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.keylen != doc_kv.keylen ||
            _doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 0, alloced_meta, alloced_body);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}